

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void swrenderer::R_ClearPlanes(bool fullclear)

{
  undefined2 uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  visplane_t *vis;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,fullclear) != 0) {
    lVar2 = 0;
    puVar5 = (undefined8 *)freehead;
    do {
      *puVar5 = (&visplanes)[lVar2];
      (&visplanes)[lVar2] = 0;
      uVar1 = (undefined2)viewheight;
      puVar6 = (undefined8 *)*puVar5;
      while (puVar7 = puVar6, puVar7 != (undefined8 *)0x0) {
        puVar5 = puVar7;
        freehead = (undefined *)puVar7;
        puVar6 = (undefined8 *)*puVar7;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x81);
    uVar3 = (ulong)(uint)viewwidth;
    if (uVar3 != 0) {
      lVar2 = 0;
      do {
        *(undefined2 *)((long)&floorclip + lVar2) = uVar1;
        lVar2 = lVar2 + 2;
      } while (uVar3 * 2 != lVar2);
    }
    if (((screen->Accel2D != false) ||
        (iVar4 = ConBottom - viewwindowy, iVar4 == 0 || ConBottom < viewwindowy)) ||
       (bRenderingToCanvas != '\0')) {
      iVar4 = 0;
    }
    if (uVar3 != 0) {
      lVar2 = 0;
      do {
        *(short *)((long)&ceilingclip + lVar2) = (short)iVar4;
        lVar2 = lVar2 + 2;
      } while (uVar3 * 2 != lVar2);
    }
    lastopening = 0;
    return;
  }
  lVar2 = 0;
  do {
    puVar5 = (undefined8 *)(&visplanes)[lVar2];
    if (puVar5 != (undefined8 *)0x0) {
      puVar6 = &visplanes + lVar2;
      do {
        puVar7 = puVar5;
        if (-1 < *(int *)(puVar5 + 0x11)) {
          *(undefined8 **)freehead = puVar5;
          *puVar6 = *puVar5;
          *puVar5 = 0;
          puVar7 = puVar6;
          freehead = (undefined *)puVar5;
        }
        puVar5 = (undefined8 *)*puVar7;
        puVar6 = puVar7;
      } while (puVar5 != (undefined8 *)0x0);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void R_ClearPlanes (bool fullclear)
{
	int i;

	// Don't clear fake planes if not doing a full clear.
	if (!fullclear)
	{
		for (i = 0; i <= MAXVISPLANES-1; i++)	// new code -- killough
		{
			for (visplane_t **probe = &visplanes[i]; *probe != NULL; )
			{
				if ((*probe)->sky < 0)
				{ // fake: move past it
					probe = &(*probe)->next;
				}
				else
				{ // not fake: move to freelist
					visplane_t *vis = *probe;
					*freehead = vis;
					*probe = vis->next;
					vis->next = NULL;
					freehead = &vis->next;
				}
			}
		}
	}
	else
	{
		for (i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
		{
			for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
			{
				freehead = &(*freehead)->next;
			}
		}

		// opening / clipping determination
		fillshort (floorclip, viewwidth, viewheight);
		// [RH] clip ceiling to console bottom
		fillshort (ceilingclip, viewwidth,
			!screen->Accel2D && ConBottom > viewwindowy && !bRenderingToCanvas
			? (ConBottom - viewwindowy) : 0);

		lastopening = 0;
	}
}